

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

apx_error_t
compile_limit_values_uint64
          (apx_compiler_t *self,uint8_t limit_variant,uint64_t lower_limit,uint64_t upper_limit)

{
  adt_error_t error_code;
  byte local_51;
  adt_error_t rc;
  uint8_t elem_size;
  uint8_t *p;
  uint8_t buf [16];
  int local_2c;
  apx_error_t retval;
  uint64_t upper_limit_local;
  uint64_t lower_limit_local;
  uint8_t limit_variant_local;
  apx_compiler_t *self_local;
  
  local_2c = 0;
  local_51 = 0;
  if (limit_variant == '\x04') {
    local_51 = 8;
  }
  else {
    local_2c = 10;
  }
  packLE64((uint8_t *)&p,lower_limit,local_51);
  packLE64((uint8_t *)((long)&p + (long)(int)(uint)local_51),upper_limit,local_51);
  if (local_2c == 0) {
    error_code = adt_bytearray_append(self->program,(uint8_t *)&p,(uint)local_51 << 1);
    local_2c = convert_from_adt_to_apx_error(error_code);
  }
  return local_2c;
}

Assistant:

static apx_error_t compile_limit_values_uint64(apx_compiler_t* self, uint8_t limit_variant, uint64_t lower_limit, uint64_t upper_limit)
{
   apx_error_t retval = APX_NO_ERROR;
   uint8_t buf[UINT64_SIZE * 2];
   uint8_t* p = &buf[0];
   uint8_t elem_size = 0u;

   assert(sizeof(buf) == 16);
   switch (limit_variant)
   {
   case APX_VM_VARIANT_LIMIT_CHECK_U64:
      elem_size = UINT64_SIZE;
      break;
   default:
      retval = APX_UNSUPPORTED_ERROR;
   }
   packLE64(p, lower_limit, elem_size);
   p += elem_size;
   packLE64(p, upper_limit, elem_size);
   if (retval == APX_NO_ERROR)
   {
      adt_error_t rc = adt_bytearray_append(self->program, &buf[0], elem_size * 2);
      retval = convert_from_adt_to_apx_error(rc);
   }
   return retval;
}